

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitThrowRef
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,ThrowRef *curr)

{
  bool bVar1;
  Literal local_58;
  Literal *local_40;
  Literal *exnref;
  undefined1 local_21;
  ThrowRef *local_20;
  ThrowRef *curr_local;
  ExpressionRunner<wasm::ModuleRunner> *this_local;
  Flow *flow;
  
  local_21 = 0;
  local_20 = curr;
  curr_local = (ThrowRef *)this;
  this_local = (ExpressionRunner<wasm::ModuleRunner> *)__return_storage_ptr__;
  visit(__return_storage_ptr__,this,curr->exnref);
  bVar1 = Flow::breaking(__return_storage_ptr__);
  if (bVar1) {
    return __return_storage_ptr__;
  }
  local_40 = Flow::getSingleValue(__return_storage_ptr__);
  bVar1 = wasm::Literal::isNull(local_40);
  if (bVar1) {
    (*this->_vptr_ExpressionRunner[2])(this,"null ref");
  }
  bVar1 = wasm::Literal::isExn(local_40);
  if (!bVar1) {
    __assert_fail("exnref.isExn()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                  ,0x631,
                  "Flow wasm::ExpressionRunner<wasm::ModuleRunner>::visitThrowRef(ThrowRef *) [SubType = wasm::ModuleRunner]"
                 );
  }
  wasm::Literal::Literal(&local_58,local_40);
  (*this->_vptr_ExpressionRunner[4])(this,&local_58);
  WasmException::~WasmException((WasmException *)&local_58);
  handle_unreachable("throw",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                     ,0x633);
}

Assistant:

Flow visitThrowRef(ThrowRef* curr) {
    NOTE_ENTER("ThrowRef");
    Flow flow = visit(curr->exnref);
    if (flow.breaking()) {
      return flow;
    }
    const auto& exnref = flow.getSingleValue();
    NOTE_EVAL1(exnref);
    if (exnref.isNull()) {
      trap("null ref");
    }
    assert(exnref.isExn());
    throwException(WasmException{exnref});
    WASM_UNREACHABLE("throw");
  }